

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (buffer_appender<char> out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  significand_type sVar1;
  size_t size;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  buffer_appender<char> bVar6;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  buffer<char> *buf;
  ulong uVar13;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_85 [5];
  decimal_fp<float> local_80;
  sign_t local_78;
  int local_74;
  uint local_70;
  undefined1 local_6c [4];
  anon_class_56_7_a2a26a24 local_68;
  
  local_70 = fp->significand;
  uVar7 = 0x1f;
  if ((local_70 | 1) != 0) {
    for (; (local_70 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  local_74 = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar7 * 2) -
             (uint)(local_70 <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar7 * 2) * 4));
  local_80.exponent = fspecs._4_4_;
  local_78 = (uint)local_80.exponent >> 8 & 0xff;
  local_85[0] = decimal_point;
  local_80 = (decimal_fp<float>)fspecs;
  if (local_74 < 0) goto LAB_003c9c4f;
  uVar9 = (local_74 + 1) - (uint)(local_78 == none);
  uVar10 = (ulong)uVar9;
  iVar4 = fp->exponent;
  sVar1 = iVar4 + local_74;
  uVar7 = fspecs.precision;
  if (fspecs._4_1_ != '\x01') {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar11 = 0x10;
      if (0 < (int)uVar7) {
        uVar11 = uVar7;
      }
      if (((int)sVar1 < -3) || ((int)uVar11 < (int)sVar1)) goto LAB_003c99b9;
    }
    local_6c = (undefined1  [4])sVar1;
    if (iVar4 < 0) {
      if (0 < (int)sVar1) {
        local_85._1_4_ = uVar7 - local_74 & (local_80.exponent << 0xb) >> 0x1f;
        local_68.decimal_point = local_85 + 1;
        uVar5 = (ulong)(uint)local_85._1_4_;
        if ((int)local_85._1_4_ < 1) {
          uVar5 = 0;
        }
        size = uVar5 + 1 + uVar10;
        local_68.sign = &local_78;
        local_68.significand = &local_70;
        local_68.significand_size = &local_74;
        local_68.fp = (decimal_fp<float> *)local_6c;
        local_68.fspecs = (float_specs *)local_85;
        bVar6 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_&>
                          (out,specs,size,size,(anon_class_48_6_48d028d1 *)&local_68);
        return (buffer_appender<char>)
               bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
      }
      uVar9 = -sVar1;
      local_85._1_4_ = uVar9;
      if (SBORROW4(uVar7,uVar9) != (int)(uVar7 + sVar1) < 0) {
        local_85._1_4_ = uVar7;
      }
      if ((int)uVar7 < 0) {
        local_85._1_4_ = uVar9;
      }
      if (local_74 != 0) {
        local_85._1_4_ = uVar9;
      }
      if (-1 < (int)local_85._1_4_) {
        local_68.sign = &local_78;
        local_68.significand = (significand_type *)(local_85 + 1);
        local_68.significand_size = &local_74;
        local_68.fp = &local_80;
        local_68.fspecs = (float_specs *)local_85;
        local_68.decimal_point = (char *)&local_70;
        uVar5 = (ulong)specs->width;
        if (-1 < (long)uVar5) {
          uVar10 = (uint)local_85._1_4_ + uVar10 + 2;
          uVar13 = 0;
          if (uVar10 <= uVar5) {
            uVar13 = uVar5 - uVar10;
          }
          bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)specs->field_0x9 & 0xf));
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              uVar10 + *(long *)((long)out.
                                       super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                       container + 0x10) + (specs->fill).size_ * uVar13) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar10 = uVar13 >> (bVar2 & 0x3f);
          bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar10,&specs->fill);
          it.container = (buffer<char> *)
                         write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                         ::anon_class_48_6_9afe1116::operator()
                                   ((anon_class_48_6_9afe1116 *)&local_68,
                                    bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                    .container);
          goto LAB_003c9ac1;
        }
      }
    }
    else {
      uVar10 = (ulong)(iVar4 + uVar9);
      local_85._1_4_ = uVar7 - sVar1;
      if (((uint)local_80.exponent >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_85._1_4_ < 1)) {
          local_85._1_4_ = 1;
        }
        if (0 < (long)(int)local_85._1_4_) {
          uVar10 = uVar10 + (long)(int)local_85._1_4_;
        }
      }
      local_68.sign = &local_78;
      local_68.significand = &local_70;
      local_68.significand_size = &local_74;
      local_68.fspecs = (float_specs *)&local_80;
      local_68.decimal_point = local_85;
      local_68.num_zeros = (int *)(local_85 + 1);
      uVar5 = (ulong)specs->width;
      local_68.fp = fp;
      if (-1 < (long)uVar5) {
        uVar13 = 0;
        if (uVar10 <= uVar5) {
          uVar13 = uVar5 - uVar10;
        }
        bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf));
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            uVar10 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                     container + 0x10) + (specs->fill).size_ * uVar13) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        uVar10 = uVar13 >> (bVar2 & 0x3f);
        bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar10,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                       ::anon_class_56_7_a2a26a24::operator()
                                 (&local_68,
                                  bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
        goto LAB_003c9ac1;
      }
    }
LAB_003c9c4f:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
LAB_003c99b9:
  iVar4 = iVar4 + local_74 + -1;
  if (((uint)local_80.exponent >> 0x14 & 1) == 0) {
    iVar8 = 0;
    if (local_74 == 1) {
      local_85[0] = '\0';
    }
  }
  else {
    iVar8 = 0;
    if (0 < (int)(uVar7 - local_74)) {
      iVar8 = uVar7 - local_74;
    }
    uVar10 = (ulong)(uVar9 + iVar8);
  }
  iVar3 = 1 - sVar1;
  if (0 < (int)sVar1) {
    iVar3 = iVar4;
  }
  lVar12 = 2;
  if (99 < iVar3) {
    lVar12 = (ulong)(999 < iVar3) + 3;
  }
  uVar5 = (3 - (ulong)(local_85[0] == '\0')) + uVar10 + lVar12;
  local_68.sign = (sign_t *)(CONCAT44(local_70,(uint)local_80.exponent >> 8) & 0xffffffff000000ff);
  local_68.significand._0_5_ = CONCAT14(local_85[0],local_74);
  local_68.significand_size =
       (int *)(CONCAT35(local_68.significand_size._5_3_,
                        CONCAT14((((uint)local_80.exponent >> 0x10 & 1) == 0) << 5,iVar8)) |
              0x4500000000);
  local_68.fp = (decimal_fp<float> *)CONCAT44(local_68.fp._4_4_,iVar4);
  uVar10 = (ulong)specs->width;
  if ((long)uVar10 < 1) {
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10)) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    bVar6 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
            ::anon_class_28_7_94dcc806::operator()
                      ((anon_class_28_7_94dcc806 *)&local_68,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return (buffer_appender<char>)
           bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  uVar13 = 0;
  if (uVar5 <= uVar10) {
    uVar13 = uVar10 - uVar5;
  }
  bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)specs->field_0x9 & 0xf));
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + (specs->fill).size_ * uVar13) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar10 = uVar13 >> (bVar2 & 0x3f);
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar10,&specs->fill);
  it.container = (buffer<char> *)
                 write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                 ::anon_class_28_7_94dcc806::operator()
                           ((anon_class_28_7_94dcc806 *)&local_68,
                            bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container);
LAB_003c9ac1:
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar13 - uVar10,&specs->fill);
  return (buffer_appender<char>)
         bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}